

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_reader_suite.cpp
# Opt level: O1

void whitespace_suite::white_only(void)

{
  bool bVar1;
  chunk_reader reader;
  undefined4 local_164;
  view_type local_160;
  basic_reader<char> local_150;
  
  trial::protocol::json::basic_reader<char>::basic_reader(&local_150);
  local_160._M_len = 1;
  local_160._M_str = "\n";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&local_150,&local_160);
  boost::detail::test_impl
            ("!reader.next(\"\\n\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xb1,"void whitespace_suite::white_only()",!bVar1);
  local_160._M_len = CONCAT44(local_160._M_len._4_4_,local_150.decoder.current.code);
  local_164 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xb2,"void whitespace_suite::white_only()",&local_160,&local_164);
  local_160._M_len = 2;
  local_160._M_str = "\n\n";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&local_150,&local_160);
  boost::detail::test_impl
            ("!reader.next(\"\\n\\n\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xb3,"void whitespace_suite::white_only()",!bVar1);
  local_160._M_len = CONCAT44(local_160._M_len._4_4_,local_150.decoder.current.code);
  local_164 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xb4,"void whitespace_suite::white_only()",&local_160,&local_164);
  local_160._M_len = 3;
  local_160._M_str = "\n\n\n";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&local_150,&local_160);
  boost::detail::test_impl
            ("!reader.next(\"\\n\\n\\n\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xb5,"void whitespace_suite::white_only()",!bVar1);
  local_160._M_len = CONCAT44(local_160._M_len._4_4_,local_150.decoder.current.code);
  local_164 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0xb6,"void whitespace_suite::white_only()",&local_160,&local_164);
  if (local_150.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void white_only()
{
    json::chunk_reader reader;
    TRIAL_PROTOCOL_TEST(!reader.next("\n"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
    TRIAL_PROTOCOL_TEST(!reader.next("\n\n"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
    TRIAL_PROTOCOL_TEST(!reader.next("\n\n\n"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
}